

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void kwsysProcessClosePipes(cmsysProcess *cp)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  int local_14;
  int i;
  cmsysProcess *cp_local;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    if (-1 < cp->PipeReadEnds[local_14]) {
      if (((cp->PipeSet).fds_bits[cp->PipeReadEnds[local_14] / 0x40] &
          1L << ((byte)((long)cp->PipeReadEnds[local_14] % 0x40) & 0x3f)) != 0) {
        iVar3 = cp->PipeReadEnds[local_14] / 0x40;
        (cp->PipeSet).fds_bits[iVar3] =
             (1L << ((byte)((long)cp->PipeReadEnds[local_14] % 0x40) & 0x3f) ^ 0xffffffffffffffffU)
             & (cp->PipeSet).fds_bits[iVar3];
        do {
          sVar1 = read(cp->PipeReadEnds[local_14],cp->PipeBuffer,0x400);
          bVar4 = false;
          if (sVar1 < 0) {
            piVar2 = __errno_location();
            bVar4 = *piVar2 == 4;
          }
        } while (bVar4);
      }
      kwsysProcessCleanupDescriptor(cp->PipeReadEnds + local_14);
      cp->PipesLeft = cp->PipesLeft + -1;
    }
  }
  return;
}

Assistant:

static void kwsysProcessClosePipes(kwsysProcess* cp)
{
  int i;

  /* Close any pipes that are still open.  */
  for (i = 0; i < KWSYSPE_PIPE_COUNT; ++i) {
    if (cp->PipeReadEnds[i] >= 0) {
#if KWSYSPE_USE_SELECT
      /* If the pipe was reported by the last call to select, we must
         read from it.  This is needed to satisfy the suggestions from
         "man select_tut" and is not needed for the polling
         implementation.  Ignore the data.  */
      if (FD_ISSET(cp->PipeReadEnds[i], &cp->PipeSet)) {
        /* We are handling this pipe now.  Remove it from the set.  */
        FD_CLR(cp->PipeReadEnds[i], &cp->PipeSet);

        /* The pipe is ready to read without blocking.  Keep trying to
           read until the operation is not interrupted.  */
        while ((read(cp->PipeReadEnds[i], cp->PipeBuffer,
                     KWSYSPE_PIPE_BUFFER_SIZE) < 0) &&
               (errno == EINTR)) {
        }
      }
#endif

      /* We are done reading from this pipe.  */
      kwsysProcessCleanupDescriptor(&cp->PipeReadEnds[i]);
      --cp->PipesLeft;
    }
  }
}